

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

void write<int>(vector<char,_std::allocator<char>_> *buffer,size_t *position,int *x,size_t count)

{
  ulong uVar1;
  pointer pcVar2;
  ulong __new_size;
  size_t sVar3;
  
  sVar3 = *position;
  __new_size = sVar3 + count;
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)pcVar2) < __new_size) {
    uVar1 = (ulong)((float)__new_size * 1.5);
    std::vector<char,_std::allocator<char>_>::reserve
              (buffer,(long)((float)__new_size * 1.5 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1);
    sVar3 = *position;
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __new_size = sVar3 + count;
  }
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar2) < __new_size) {
    std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
    sVar3 = *position;
  }
  if (count != 0) {
    memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + sVar3,x,count);
    sVar3 = *position;
  }
  *position = sVar3 + count;
  return;
}

Assistant:

void write(std::vector<char>& buffer, size_t& position, const T& x, size_t count = sizeof(T))
{
    if (position + count > buffer.capacity())
        buffer.reserve((position + count) * growth_multiplier);         // if we have to grow, grow geometrically

    if (position + count > buffer.size())
        buffer.resize(position + count);

    const char* x_ptr = (const char*) &x;
    std::copy(x_ptr, x_ptr + count, &buffer[position]);
    position += count;
}